

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int m_select_code_option(aec_stream *strm)

{
  int iVar1;
  internal_state *piVar2;
  uint8_t *puVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  code *pcVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  internal_state *state;
  int iVar16;
  ulong *puVar17;
  size_t i;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  ulong uVar22;
  bool bVar23;
  
  piVar2 = strm->state;
  iVar15 = piVar2->id_len;
  uVar13 = strm->block_size;
  uVar18 = (ulong)uVar13;
  if (iVar15 < 2) {
    uVar13 = 0xffffffff;
  }
  else {
    iVar16 = uVar13 - piVar2->ref;
    iVar1 = piVar2->k;
    bVar21 = false;
    iVar6 = iVar1;
    bVar23 = iVar1 == 0;
    iVar10 = iVar1;
    uVar19 = 0xffffffffffffffff;
    do {
      do {
        while( true ) {
          while( true ) {
            bVar5 = bVar23;
            iVar4 = iVar6;
            if (uVar13 == 0) {
              uVar14 = 0;
            }
            else {
              uVar20 = 0;
              uVar14 = 0;
              do {
                uVar14 = uVar14 + (piVar2->block[uVar20] >> ((byte)iVar4 & 0x1f));
                uVar20 = uVar20 + 1;
              } while (uVar18 != uVar20);
            }
            uVar20 = (long)((iVar4 + 1) * iVar16) + uVar14;
            if (uVar20 < uVar19) break;
            bVar21 = true;
            iVar6 = iVar1 + -1;
            bVar23 = true;
            if (bVar5) goto LAB_001296db;
          }
          if (uVar19 != 0xffffffffffffffff) {
            bVar5 = true;
          }
          uVar19 = uVar20;
          iVar10 = iVar4;
          bVar23 = bVar5;
          if (!bVar21) break;
          if ((iVar4 == 0) || (bVar21 = true, iVar6 = iVar4 + -1, (ulong)(long)iVar16 <= uVar14))
          goto LAB_001296db;
        }
      } while (((ulong)(long)iVar16 <= uVar14) &&
              (bVar21 = false, iVar6 = iVar4 + 1, iVar4 < piVar2->kmax));
      bVar21 = true;
      iVar6 = iVar1 + -1;
      bVar23 = true;
    } while (!bVar5);
LAB_001296db:
    uVar13 = (uint)uVar19;
    piVar2->k = iVar10;
  }
  uVar9 = piVar2->uncomp_len;
  if (uVar18 == 0) {
    uVar7 = 1;
  }
  else {
    uVar14 = 1;
    uVar19 = 2;
    do {
      uVar20 = (ulong)piVar2->block[uVar19 - 2];
      uVar22 = (ulong)piVar2->block[uVar19 - 1];
      uVar14 = uVar14 + uVar22 + ((uVar20 + uVar22 + 1) * (uVar22 + uVar20) >> 1) + 1;
      if (uVar9 < uVar14) break;
      bVar23 = uVar19 < uVar18;
      uVar19 = uVar19 + 2;
    } while (bVar23);
    uVar7 = 0xffffffff;
    if (uVar14 <= uVar9) {
      uVar7 = (uint)uVar14;
    }
  }
  if (uVar13 < uVar9) {
    if (uVar7 <= uVar13) {
LAB_001297b2:
      m_encode_se(strm);
      return 1;
    }
    iVar1 = piVar2->bits;
    uVar13 = piVar2->k;
    uVar9 = uVar13 + 1;
    if (iVar1 < iVar15) {
      uVar7 = iVar15 - iVar1;
      puVar3 = piVar2->cds;
      piVar2->cds = puVar3 + 1;
      *puVar3 = *puVar3 + (char)(uVar9 >> ((byte)uVar7 & 0x3f));
      uVar8 = uVar7;
      if (8 < (int)uVar7) {
        do {
          uVar7 = uVar8 - 8;
          puVar3 = piVar2->cds;
          piVar2->cds = puVar3 + 1;
          *puVar3 = (uint8_t)(uVar9 >> ((byte)uVar7 & 0x1f));
          bVar23 = 0x10 < uVar8;
          uVar8 = uVar7;
        } while (bVar23);
      }
      piVar2->bits = 8 - uVar7;
      *piVar2->cds = (uint8_t)(uVar9 << ((byte)(8 - uVar7) & 0x1f));
    }
    else {
      piVar2->bits = iVar1 - iVar15;
      *piVar2->cds = *piVar2->cds + (char)(uVar9 << ((byte)(iVar1 - iVar15) & 0x1f));
    }
    if (piVar2->ref != 0) {
      iVar15 = piVar2->bits;
      uVar7 = piVar2->ref_sample;
      uVar9 = strm->bits_per_sample;
      if (iVar15 < (int)uVar9) {
        uVar9 = uVar9 - iVar15;
        puVar3 = piVar2->cds;
        piVar2->cds = puVar3 + 1;
        *puVar3 = *puVar3 + (char)(uVar7 >> ((byte)uVar9 & 0x3f));
        uVar8 = uVar9;
        if (8 < (int)uVar9) {
          do {
            uVar9 = uVar8 - 8;
            puVar3 = piVar2->cds;
            piVar2->cds = puVar3 + 1;
            *puVar3 = (uint8_t)(uVar7 >> ((byte)uVar9 & 0x1f));
            bVar23 = 0x10 < uVar8;
            uVar8 = uVar9;
          } while (bVar23);
        }
        piVar2->bits = 8 - uVar9;
        *piVar2->cds = (uint8_t)(uVar7 << ((byte)(8 - uVar9) & 0x1f));
      }
      else {
        piVar2->bits = iVar15 - uVar9;
        *piVar2->cds = *piVar2->cds + (char)(uVar7 << ((byte)(iVar15 - uVar9) & 0x1f));
      }
    }
    uVar18 = (ulong)piVar2->ref;
    piVar2 = strm->state;
    puVar17 = (ulong *)piVar2->cds;
    uVar19 = (ulong)(byte)*puVar17 << 0x38;
    uVar9 = 7 - piVar2->bits;
    uVar14 = (ulong)strm->block_size;
    if (uVar18 < uVar14) {
      do {
        uVar9 = uVar9 + (piVar2->block[uVar18] >> ((byte)uVar13 & 0x1f)) + 1;
        if (0x3f < uVar9) {
          do {
            *puVar17 = uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                       (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                       (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                       (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38;
            puVar17 = (ulong *)(piVar2->cds + 8);
            piVar2->cds = (uint8_t *)puVar17;
            uVar9 = uVar9 - 0x40;
            uVar19 = 0;
          } while (0x3f < uVar9);
          uVar14 = (ulong)strm->block_size;
          uVar19 = 0;
        }
        uVar19 = uVar19 | 1L << ((ulong)(byte)((byte)uVar9 ^ 0x3f) & 0x3f);
        uVar18 = uVar18 + 1;
      } while (uVar18 < uVar14);
    }
    *puVar17 = uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
               (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
               (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 | (uVar19 & 0xff00) << 0x28
               | uVar19 << 0x38;
    piVar2->cds = piVar2->cds + (uVar9 >> 3);
    piVar2->bits = ~uVar9 & 7;
    if (uVar13 == 0) goto LAB_001299d2;
    uVar9 = strm->block_size;
    iVar15 = (int)strm->state;
  }
  else {
    if (uVar7 < uVar9) goto LAB_001297b2;
    uVar13 = ~(-1 << ((byte)iVar15 & 0x1f));
    iVar1 = piVar2->bits;
    if (iVar1 < iVar15) {
      uVar9 = iVar15 - iVar1;
      puVar3 = piVar2->cds;
      piVar2->cds = puVar3 + 1;
      *puVar3 = *puVar3 + (char)(uVar13 >> ((byte)uVar9 & 0x3f));
      uVar7 = uVar9;
      if (8 < (int)uVar9) {
        do {
          uVar9 = uVar7 - 8;
          puVar3 = piVar2->cds;
          piVar2->cds = puVar3 + 1;
          *puVar3 = (uint8_t)(uVar13 >> ((byte)uVar9 & 0x1f));
          bVar23 = 0x10 < uVar7;
          uVar7 = uVar9;
        } while (bVar23);
      }
      piVar2->bits = 8 - uVar9;
      *piVar2->cds = (uint8_t)(uVar13 << ((byte)(8 - uVar9) & 0x1f));
    }
    else {
      piVar2->bits = iVar1 - iVar15;
      *piVar2->cds = *piVar2->cds + (char)(uVar13 << ((byte)(iVar1 - iVar15) & 0x1f));
    }
    if (piVar2->ref != 0) {
      *piVar2->block = piVar2->ref_sample;
    }
    uVar13 = strm->bits_per_sample;
    uVar9 = strm->block_size;
    iVar15 = (int)strm->state;
  }
  emitblock((aec_stream *)(ulong)uVar9,iVar15,uVar13);
LAB_001299d2:
  piVar2 = strm->state;
  if (piVar2->direct_out == 0) {
    piVar2->i = 0;
    pcVar12 = m_flush_block_resumable;
  }
  else {
    lVar11 = (long)(*(int *)&piVar2->cds - (int)strm->next_out);
    strm->next_out = strm->next_out + lVar11;
    strm->avail_out = strm->avail_out - lVar11;
    pcVar12 = m_get_block;
  }
  piVar2->mode = pcVar12;
  return 1;
}

Assistant:

static int m_select_code_option(struct aec_stream *strm)
{
    /**
       Decide which code option to use.
    */

    struct internal_state *state = strm->state;

    uint32_t split_len;
    if (state->id_len > 1)
        split_len = assess_splitting_option(strm);
    else
        split_len = UINT32_MAX;
    uint32_t se_len = assess_se_option(strm);

    if (split_len < state->uncomp_len) {
        if (split_len < se_len)
            return m_encode_splitting(strm);
        else
            return m_encode_se(strm);
    } else {
        if (state->uncomp_len <= se_len)
            return m_encode_uncomp(strm);
        else
            return m_encode_se(strm);
    }
}